

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void curses_update_screen(nh_dbuf_entry (*dbuf) [80],wchar_t ux,wchar_t uy)

{
  wchar_t uy_local;
  wchar_t ux_local;
  nh_dbuf_entry (*dbuf_local) [80];
  
  display_buffer = dbuf;
  draw_map(ux,uy);
  if (ux < L'\x01') {
    curs_set(0);
  }
  else {
    wmove(mapwin,uy,ux + L'\xffffffff');
    curs_set(1);
  }
  wnoutrefresh(mapwin);
  return;
}

Assistant:

void curses_update_screen(struct nh_dbuf_entry dbuf[ROWNO][COLNO], int ux, int uy)
{
    display_buffer = dbuf;
    draw_map(ux, uy);
    
    if (ux > 0) {
	wmove(mapwin, uy, ux - 1);
	curs_set(1);
    } else
	curs_set(0);
    wnoutrefresh(mapwin);
}